

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

int duckdb_brotli::SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint64_t *puVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  ulong in_RAX;
  ulong uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  undefined4 extraout_var;
  byte *pbVar12;
  HuffmanCode *pHVar13;
  HuffmanCode *pHVar14;
  long lVar15;
  ulong uVar16;
  uint64_t uVar17;
  ulong in_R11;
  bool bVar18;
  uint64_t block_type;
  uint64_t index;
  ulong local_58;
  ulong local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar4 = s->num_block_types[0];
  if (uVar4 < 2) {
    return 0;
  }
  br = &s->br;
  local_48 = (undefined4)(s->br).val_;
  uStack_44 = *(undefined4 *)((long)&(s->br).val_ + 4);
  uStack_40 = (undefined4)(s->br).bit_pos_;
  uStack_3c = *(undefined4 *)((long)&(s->br).bit_pos_ + 4);
  puVar5 = (s->br).next_in;
  pbVar6 = (s->br).last_in;
  uVar9 = (s->br).bit_pos_;
  bVar18 = uVar9 < 0xf;
  if (bVar18) {
    pbVar12 = (s->br).next_in;
    if (pbVar12 != pbVar6) {
      uVar16 = br->val_;
      do {
        in_RAX = uVar16;
        uVar16 = (ulong)*pbVar12 << ((byte)uVar9 & 0x3f) | in_RAX;
        (s->br).val_ = uVar16;
        (s->br).bit_pos_ = uVar9 + 8;
        pbVar12 = pbVar12 + 1;
        (s->br).next_in = pbVar12;
        bVar18 = uVar9 < 7;
        if (!bVar18) goto LAB_01d6a33a;
        uVar9 = uVar9 + 8;
      } while (pbVar12 != pbVar6);
    }
  }
  else {
LAB_01d6a33a:
    in_RAX = (ulong)((uint)br->val_ & 0x7fff);
  }
  pHVar14 = s->block_len_trees;
  if (bVar18) {
    iVar8 = SafeDecodeSymbol(s->block_type_trees,br,&local_58);
    uVar9 = CONCAT44(extraout_var,iVar8);
    if (iVar8 == 0) {
      return 0;
    }
  }
  else {
    pHVar13 = s->block_type_trees + (in_RAX & 0xff);
    bVar2 = pHVar13->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 - 8;
      (s->br).val_ = (s->br).val_ >> 8;
      pHVar13 = pHVar13 + (in_RAX >> 8 & *(ulong *)(kBrotliBitMask + (ulong)(bVar2 - 8) * 8)) +
                          (ulong)pHVar13->value;
    }
    bVar2 = pHVar13->bits;
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 - (ulong)bVar2;
    (s->br).val_ = (s->br).val_ >> (bVar2 & 0x3f);
    uVar9 = (ulong)pHVar13->value;
    local_58 = uVar9;
  }
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar16 = (s->br).bit_pos_;
    bVar18 = uVar16 < 0xf;
    if (bVar18) {
      pbVar12 = (s->br).next_in;
      pbVar7 = (s->br).last_in;
      if (pbVar12 != pbVar7) {
        uVar17 = br->val_;
        do {
          uVar9 = uVar17;
          uVar17 = (ulong)*pbVar12 << ((byte)uVar16 & 0x3f) | uVar9;
          (s->br).val_ = uVar17;
          (s->br).bit_pos_ = uVar16 + 8;
          pbVar12 = pbVar12 + 1;
          (s->br).next_in = pbVar12;
          bVar18 = uVar16 < 7;
          if (!bVar18) goto LAB_01d6a40d;
          uVar16 = uVar16 + 8;
        } while (pbVar12 != pbVar7);
      }
    }
    else {
LAB_01d6a40d:
      uVar9 = (ulong)((uint)br->val_ & 0x7fff);
    }
    if (bVar18) {
      iVar8 = SafeDecodeSymbol(pHVar14,br,&local_50);
      if (iVar8 == 0) goto LAB_01d6a526;
    }
    else {
      pHVar14 = pHVar14 + (uVar9 & 0xff);
      bVar2 = pHVar14->bits;
      if (8 < bVar2) {
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 - 8;
        (s->br).val_ = (s->br).val_ >> 8;
        pHVar14 = pHVar14 + (uVar9 >> 8 & *(ulong *)(kBrotliBitMask + (ulong)(bVar2 - 8) * 8)) +
                            (ulong)pHVar14->value;
      }
      bVar2 = pHVar14->bits;
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 - (ulong)bVar2;
      (s->br).val_ = (s->br).val_ >> (bVar2 & 0x3f);
      local_50 = (ulong)pHVar14->value;
    }
  }
  else {
    local_50 = s->block_length_index;
  }
  bVar2 = _kBrotliPrefixCodeRanges[local_50 * 4 + 2];
  uVar10 = (ulong)bVar2;
  uVar3 = *(ushort *)(_kBrotliPrefixCodeRanges + local_50 * 4);
  uVar16 = (s->br).bit_pos_;
  bVar18 = uVar16 < uVar10;
  uVar9 = uVar16;
  if (bVar18) {
    pbVar12 = (s->br).next_in;
    pbVar7 = (s->br).last_in;
    if (pbVar12 != pbVar7) {
      uVar17 = br->val_;
      do {
        uVar17 = (ulong)*pbVar12 << ((byte)uVar16 & 0x3f) | uVar17;
        (s->br).val_ = uVar17;
        uVar9 = uVar16 + 8;
        (s->br).bit_pos_ = uVar9;
        pbVar12 = pbVar12 + 1;
        (s->br).next_in = pbVar12;
        bVar18 = uVar9 < uVar10;
        if (!bVar18) goto LAB_01d6a4d8;
        uVar16 = uVar16 + 8;
      } while (pbVar12 != pbVar7);
    }
  }
  else {
LAB_01d6a4d8:
    uVar16 = (s->br).val_;
    in_R11 = *(ulong *)(kBrotliBitMask + uVar10 * 8) & uVar16;
    (s->br).bit_pos_ = uVar9 - uVar10;
    (s->br).val_ = uVar16 >> (bVar2 & 0x3f);
  }
  if (!bVar18) {
    s->block_length[0] = in_R11 + uVar3;
  }
  else {
    s->block_length_index = local_50;
  }
  s->substate_read_block_length = (uint)bVar18;
  if (!bVar18) {
    if (local_58 == 0) {
      local_58 = s->block_type_rb[0];
    }
    else if (local_58 == 1) {
      local_58 = s->block_type_rb[1] + 1;
    }
    else {
      local_58 = local_58 - 2;
    }
    if (uVar4 <= local_58) {
      local_58 = local_58 - uVar4;
    }
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_58;
    s->context_map_slice = s->context_map + local_58 * 0x40;
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_58 >> 5] >> ((uint)local_58 & 0x1f) & 1) != 0);
    s->literal_htree = (s->literal_hgroup).htrees[s->context_map[local_58 * 0x40]];
    s->context_lookup = &_kBrotliContextLookupTable + ((s->context_modes[local_58] & 3) << 9);
    return 1;
  }
LAB_01d6a526:
  lVar15 = (long)pbVar6 - (long)puVar5;
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  *(undefined4 *)&(s->br).val_ = local_48;
  *(undefined4 *)((long)&(s->br).val_ + 4) = uStack_44;
  *(undefined4 *)&(s->br).bit_pos_ = uStack_40;
  *(undefined4 *)((long)&(s->br).bit_pos_ + 4) = uStack_3c;
  (s->br).next_in = puVar5;
  (s->br).last_in = puVar5 + lVar15;
  puVar11 = puVar5 + lVar15 + -0x1b;
  if (0xffffffffffffffe2 < lVar15 - 0x1cU) {
    puVar11 = puVar5;
  }
  (s->br).guard_in = puVar11;
  return 0;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}